

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_func_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>
     ::func_queue_samples(ostream *i_ostream)

{
  ostream *in_stack_000003c8;
  ostream *in_stack_00000408;
  ostream *in_stack_00000508;
  ostream *in_stack_00000588;
  ostream *in_stack_00000608;
  ostream *i_ostream_local;
  
  func_queue_reentrant_misc_samples(in_stack_00000588);
  func_queue_put_samples(in_stack_00000608);
  func_queue_reentrant_put_samples(in_stack_00000508);
  func_queue_try_put_samples(in_stack_00000408);
  func_queue_try_reentrant_put_samples(in_stack_00000408);
  func_queue_reentrant_consume_samples(in_stack_000003c8);
  return;
}

Assistant:

static void func_queue_samples(std::ostream & i_ostream)
        {
            func_queue_reentrant_misc_samples(i_ostream);

            func_queue_put_samples(i_ostream);
            func_queue_reentrant_put_samples(i_ostream);
            func_queue_try_put_samples(i_ostream);
            func_queue_try_reentrant_put_samples(i_ostream);

            func_queue_reentrant_consume_samples(i_ostream);
        }